

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.cpp
# Opt level: O3

Value * xmrig::Json::getArray(Value *obj,char *key)

{
  Number in_RAX;
  Value *pVVar1;
  undefined8 local_18;
  
  local_18 = in_RAX;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&stack0xffffffffffffffe8,(Ch *)obj);
  if (local_18 == (ulong)(obj->data_).s.length * 0x20 + ((ulong)(obj->data_).s.str & 0xffffffffffff)
     ) {
    pVVar1 = (Value *)kNullValue;
  }
  else {
    pVVar1 = (Value *)kNullValue;
    if (*(short *)(local_18 + 0x1e) == 4) {
      pVVar1 = (Value *)(local_18 + 0x10);
    }
  }
  return pVVar1;
}

Assistant:

const rapidjson::Value &xmrig::Json::getArray(const rapidjson::Value &obj, const char *key)
{
    assert(obj.IsObject());

    auto i = obj.FindMember(key);
    if (i != obj.MemberEnd() && i->value.IsArray()) {
        return i->value;
    }

    return kNullValue;
}